

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void arg_print_syntax(FILE *fp,void **argtable,char *suffix)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  char *dest_4;
  char *pcVar4;
  byte *pbVar5;
  size_t __n;
  char *pcVar6;
  void *pvVar7;
  char cVar8;
  int iVar9;
  char *dest;
  ulong uVar10;
  int iVar11;
  void **ppvVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  char *pcVar16;
  char *dest_2;
  bool bVar17;
  char syntax [200];
  char local_10b [3];
  char *local_108;
  FILE *local_100;
  char local_f8 [200];
  
  pbVar5 = (byte *)*argtable;
  pcVar16 = "";
  local_108 = suffix;
  if (pbVar5 != (byte *)0x0) {
    ppvVar12 = argtable + 1;
    pcVar4 = " -%c";
    pcVar14 = " [-%c";
    do {
      if ((*pbVar5 & 1) != 0) break;
      if ((0 < *(int *)(pbVar5 + 0x28)) &&
         ((char)((*pbVar5 & 2) >> 1) == '\0' && *(char **)(pbVar5 + 8) != (char *)0x0)) {
        fprintf((FILE *)fp,pcVar4,(ulong)(uint)(int)**(char **)(pbVar5 + 8));
        pcVar4 = "%c";
        pcVar14 = "[%c";
      }
      pbVar5 = (byte *)*ppvVar12;
      ppvVar12 = ppvVar12 + 1;
    } while (pbVar5 != (byte *)0x0);
    pbVar5 = (byte *)*argtable;
    if (pbVar5 != (byte *)0x0) {
      ppvVar12 = argtable + 1;
      pcVar16 = "";
      do {
        if ((*pbVar5 & 1) != 0) break;
        if ((*(int *)(pbVar5 + 0x28) < 1) &&
           ((char)((*pbVar5 & 2) >> 1) == '\0' && *(char **)(pbVar5 + 8) != (char *)0x0)) {
          fprintf((FILE *)fp,pcVar14,(ulong)(uint)(int)**(char **)(pbVar5 + 8));
          pcVar14 = "%c";
          pcVar16 = "]";
        }
        pbVar5 = (byte *)*ppvVar12;
        ppvVar12 = ppvVar12 + 1;
      } while (pbVar5 != (byte *)0x0);
    }
  }
  fputs(pcVar16,(FILE *)fp);
  pbVar5 = (byte *)*argtable;
  if (pbVar5 == (byte *)0x0) {
LAB_0010809d:
    if (local_108 != (char *)0x0) {
      fputs(local_108,(FILE *)fp);
    }
    return;
  }
  lVar13 = 0;
  local_100 = (FILE *)fp;
LAB_00107bb3:
  if ((*pbVar5 & 1) == 0) {
    memset(local_f8,0,200);
    if (*(undefined1 **)(pbVar5 + 8) == (undefined1 *)0x0) {
      pcVar16 = *(char **)(pbVar5 + 0x10);
      pcVar4 = *(char **)(pbVar5 + 0x18);
      bVar3 = *pbVar5;
      if (pcVar16 != (char *)0x0) {
        uVar10 = 0;
        do {
          if (local_f8[uVar10] == '\0') {
            if (uVar10 < 200) {
              lVar15 = 0;
              goto LAB_00107d64;
            }
            pcVar14 = local_f8 + uVar10;
            break;
          }
          uVar10 = uVar10 + 1;
          pcVar14 = &stack0xffffffffffffffd0;
        } while (uVar10 != 200);
        goto LAB_00107e32;
      }
      if (pcVar4 != (char *)0x0) {
        if ((bVar3 & 4) != 0) {
          pcVar16 = local_f8;
          uVar10 = 0;
          pcVar14 = &stack0xffffffffffffffd0;
          do {
            if (*pcVar16 == '\0') {
              pcVar6 = pcVar16;
              if (uVar10 < 200) {
                *pcVar16 = '[';
                pcVar6 = pcVar16 + 1;
              }
              break;
            }
            uVar10 = uVar10 + 1;
            pcVar16 = pcVar16 + 1;
            pcVar6 = pcVar14;
          } while (uVar10 != 200);
          *pcVar6 = '\0';
          if (pcVar14 != pcVar6 && -1 < (long)pcVar14 - (long)pcVar6) {
            do {
              if (*pcVar6 == '\0') break;
              pcVar6 = pcVar6 + 1;
            } while (pcVar6 < pcVar14);
          }
          pcVar16 = pcVar6;
          if (pcVar6 < pcVar14) {
            pcVar16 = pcVar6 + ((long)pcVar14 - (long)pcVar6);
            lVar15 = 0;
            do {
              if (pcVar4[lVar15] == '\0') {
                pcVar16 = pcVar6 + lVar15;
                break;
              }
              pcVar6[lVar15] = pcVar4[lVar15];
              lVar15 = lVar15 + 1;
            } while ((long)pcVar14 - (long)pcVar6 != lVar15);
          }
          bVar17 = -1 < (long)pcVar14 - (long)pcVar16;
          cVar8 = '\0';
          if (pcVar14 != pcVar16 && bVar17) {
            cVar8 = ']';
          }
          *pcVar16 = cVar8;
          pcVar16[pcVar14 != pcVar16 && bVar17] = '\0';
          goto LAB_00108006;
        }
        uVar10 = 0;
        pcVar16 = &stack0xffffffffffffffd0;
        do {
          if (local_f8[uVar10] == '\0') {
            if (199 < uVar10) goto LAB_00107fd6;
            goto LAB_00107f62;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != 200);
        goto LAB_00107fdd;
      }
      goto LAB_00108006;
    }
    bVar3 = *pbVar5;
    if ((bVar3 & 2) != 0) {
      pcVar16 = *(char **)(pbVar5 + 0x18);
      local_10b[0] = '-';
      local_10b[1] = **(undefined1 **)(pbVar5 + 8);
      local_10b[2] = 0;
      uVar10 = 0;
      do {
        pcVar4 = &stack0xffffffffffffffd0;
        if (local_f8[uVar10] == '\0') {
          if (199 < uVar10) goto LAB_00107cc2;
          pcVar14 = local_10b;
          goto LAB_00107c69;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != 200);
      goto LAB_00107cc9;
    }
    goto LAB_0010808c;
  }
  goto LAB_0010809d;
  while( true ) {
    lVar1 = lVar15 + 1;
    local_f8[lVar15 + uVar10] = "--"[lVar15];
    lVar2 = uVar10 + lVar15;
    lVar15 = lVar1;
    if (lVar2 == 199) break;
LAB_00107d64:
    if (lVar15 == 2) {
      pcVar14 = local_f8 + uVar10 + 2;
      goto LAB_00107e32;
    }
  }
  pcVar14 = local_f8 + lVar1 + uVar10;
LAB_00107e32:
  *pcVar14 = '\0';
  uVar10 = (long)&stack0xffffffffffffffd0 - (long)pcVar14;
  __n = strcspn(pcVar16,",");
  if (uVar10 <= __n) {
    __n = uVar10;
  }
  strncat(pcVar14,pcVar16,__n);
  if (pcVar4 != (char *)0x0) {
    pcVar16 = pcVar14 + uVar10;
    if (0 < (long)uVar10) {
      do {
        if (*pcVar14 == '\0') break;
        pcVar14 = pcVar14 + 1;
      } while (pcVar14 < pcVar16);
    }
    if (pcVar14 < pcVar16) {
      *pcVar14 = '=';
      pcVar14 = pcVar14 + 1;
    }
    *pcVar14 = '\0';
    lVar15 = (long)&stack0xffffffffffffffd0 - (long)pcVar14;
    pcVar16 = pcVar14 + lVar15;
    if ((bVar3 & 4) == 0) {
      if (0 < lVar15) {
        do {
          if (*pcVar14 == '\0') break;
          pcVar14 = pcVar14 + 1;
        } while (pcVar14 < pcVar16);
      }
      if (pcVar14 < pcVar16) {
        lVar15 = 0;
        do {
          if (pcVar4[lVar15] == '\0') break;
          pcVar14[lVar15] = pcVar4[lVar15];
          lVar15 = lVar15 + 1;
        } while ((long)&stack0xffffffffffffffd0 - (long)pcVar14 != lVar15);
        pcVar14 = pcVar14 + lVar15;
      }
    }
    else {
      if (0 < lVar15) {
        do {
          if (*pcVar14 == '\0') break;
          pcVar14 = pcVar14 + 1;
        } while (pcVar14 < pcVar16);
      }
      if (pcVar14 < pcVar16) {
        *pcVar14 = '[';
        pcVar14 = pcVar14 + 1;
      }
      *pcVar14 = '\0';
      lVar15 = (long)&stack0xffffffffffffffd0 - (long)pcVar14;
      if (0 < lVar15) {
        pcVar16 = pcVar14 + lVar15;
        do {
          cVar8 = *pcVar4;
          if (cVar8 == '\0') break;
          pcVar4 = pcVar4 + 1;
          *pcVar14 = cVar8;
          pcVar14 = pcVar14 + 1;
        } while (pcVar14 < pcVar16);
        *pcVar14 = '\0';
        if (&stack0xffffffffffffffd0 != pcVar14 &&
            -1 < (long)&stack0xffffffffffffffd0 - (long)pcVar14) {
          *pcVar14 = ']';
          pcVar14 = pcVar14 + 1;
        }
      }
    }
    *pcVar14 = '\0';
  }
  goto LAB_00108006;
  while( true ) {
    pcVar4 = pcVar4 + 1;
    local_f8[uVar10] = cVar8;
    uVar10 = uVar10 + 1;
    if (uVar10 == 200) break;
LAB_00107f62:
    cVar8 = *pcVar4;
    if (cVar8 == '\0') goto LAB_00107fd6;
  }
LAB_00107fdd:
  *pcVar16 = '\0';
  goto LAB_00108006;
LAB_00107fd6:
  pcVar16 = local_f8 + uVar10;
  goto LAB_00107fdd;
  while( true ) {
    pcVar14 = pcVar14 + 1;
    local_f8[uVar10] = cVar8;
    uVar10 = uVar10 + 1;
    if (uVar10 == 200) break;
LAB_00107c69:
    cVar8 = *pcVar14;
    if (cVar8 == '\0') goto LAB_00107cc2;
  }
LAB_00107cc9:
  *pcVar4 = '\0';
  if (pcVar16 != (char *)0x0) {
    if (&stack0xffffffffffffffd0 != pcVar4 && -1 < (long)&stack0xffffffffffffffd0 - (long)pcVar4) {
      do {
        if (*pcVar4 == '\0') break;
        pcVar4 = pcVar4 + 1;
      } while (pcVar4 < &stack0xffffffffffffffd0);
    }
    if (pcVar4 < &stack0xffffffffffffffd0) {
      *pcVar4 = ' ';
      pcVar4 = pcVar4 + 1;
    }
    *pcVar4 = '\0';
    lVar15 = (long)&stack0xffffffffffffffd0 - (long)pcVar4;
    pcVar14 = pcVar4 + lVar15;
    if ((bVar3 & 4) == 0) {
      if (0 < lVar15) {
        do {
          if (*pcVar4 == '\0') break;
          pcVar4 = pcVar4 + 1;
        } while (pcVar4 < pcVar14);
      }
      if (pcVar4 < pcVar14) {
        lVar15 = 0;
        do {
          if (pcVar16[lVar15] == '\0') break;
          pcVar4[lVar15] = pcVar16[lVar15];
          lVar15 = lVar15 + 1;
        } while ((long)&stack0xffffffffffffffd0 - (long)pcVar4 != lVar15);
        pcVar4 = pcVar4 + lVar15;
      }
    }
    else {
      if (0 < lVar15) {
        do {
          if (*pcVar4 == '\0') break;
          pcVar4 = pcVar4 + 1;
        } while (pcVar4 < pcVar14);
      }
      if (pcVar4 < pcVar14) {
        *pcVar4 = '[';
        pcVar4 = pcVar4 + 1;
      }
      *pcVar4 = '\0';
      lVar15 = (long)&stack0xffffffffffffffd0 - (long)pcVar4;
      if (0 < lVar15) {
        pcVar14 = pcVar4 + lVar15;
        do {
          cVar8 = *pcVar16;
          if (cVar8 == '\0') break;
          pcVar16 = pcVar16 + 1;
          *pcVar4 = cVar8;
          pcVar4 = pcVar4 + 1;
        } while (pcVar4 < pcVar14);
        *pcVar4 = '\0';
        if (&stack0xffffffffffffffd0 != pcVar4 && -1 < (long)&stack0xffffffffffffffd0 - (long)pcVar4
           ) {
          *pcVar4 = ']';
          pcVar4 = pcVar4 + 1;
        }
      }
    }
    *pcVar4 = '\0';
  }
LAB_00108006:
  fp = (FILE *)local_100;
  if (local_f8[0] != '\0') {
    pvVar7 = argtable[lVar13];
    iVar9 = *(int *)((long)pvVar7 + 0x28);
    if (0 < iVar9) {
      iVar11 = 0;
      do {
        fprintf((FILE *)fp," %s",local_f8);
        iVar11 = iVar11 + 1;
        pvVar7 = argtable[lVar13];
        iVar9 = *(int *)((long)pvVar7 + 0x28);
      } while (iVar11 < iVar9);
    }
    iVar11 = *(int *)((long)pvVar7 + 0x2c) - iVar9;
    if (*(int *)((long)pvVar7 + 0x2c) != iVar9) {
      if (iVar11 == 2) {
        fprintf((FILE *)fp," [%s] [%s]",local_f8,local_f8);
      }
      else {
        if (iVar11 == 1) {
          pcVar16 = " [%s]";
        }
        else {
          pcVar16 = " [%s]...";
        }
        fprintf((FILE *)fp,pcVar16,local_f8);
      }
    }
  }
LAB_0010808c:
  pbVar5 = (byte *)argtable[lVar13 + 1];
  lVar13 = lVar13 + 1;
  if (pbVar5 == (byte *)0x0) goto LAB_0010809d;
  goto LAB_00107bb3;
LAB_00107cc2:
  pcVar4 = local_f8 + uVar10;
  goto LAB_00107cc9;
}

Assistant:

void arg_print_syntax(FILE * fp, void * *argtable, const char * suffix) {
	struct arg_hdr * *table = (struct arg_hdr * *)argtable;
	int i, tabindex;

	/* print GNU style [OPTION] string */
	arg_print_gnuswitch(fp, table);

	/* print remaining options in abbreviated style */
	for (tabindex = 0;
			table[tabindex] && !(table[tabindex]->flag & ARG_TERMINATOR);
			tabindex++) {
		char syntax[200] = "";
		const char * shortopts, *longopts, *datatype;

		/* skip short options without arg values (they were printed by arg_print_gnu_switch) */
		if (table[tabindex]->shortopts &&
				!(table[tabindex]->flag & ARG_HASVALUE)) {
			continue;
		}

		shortopts = table[tabindex]->shortopts;
		longopts  = table[tabindex]->longopts;
		datatype  = table[tabindex]->datatype;
		arg_cat_option(syntax,
					   sizeof(syntax),
					   shortopts,
					   longopts,
					   datatype,
					   table[tabindex]->flag & ARG_HASOPTVALUE);

		if (strlen(syntax) > 0) {
			/* print mandatory instances of this option */
			for (i = 0; i < table[tabindex]->mincount; i++) {
				fprintf(fp, " %s", syntax);
			}

			/* print optional instances enclosed in "[..]" */
			switch ( table[tabindex]->maxcount - table[tabindex]->mincount ) {
				case 0:
					break;

				case 1:
					fprintf(fp, " [%s]", syntax);
					break;

				case 2:
					fprintf(fp, " [%s] [%s]", syntax, syntax);
					break;

				default:
					fprintf(fp, " [%s]...", syntax);
					break;
			}
		}
	}

	if (suffix) {
		fprintf(fp, "%s", suffix);
	}
}